

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::Buffer::Verify(Buffer *this)

{
  CallLogWrapper *this_00;
  char *format;
  GLint i;
  GLint64 i64;
  void *ptr;
  uint local_2c;
  long local_28;
  void *local_20;
  
  this_00 = &(this->super_GLWrapper).super_CallLogWrapper;
  glu::CallLogWrapper::glGetBufferParameteri64v(this_00,0x92c0,0x8764,&local_28);
  if (local_28 == this->size_) {
    glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x92c0,0x8765,(GLint *)&local_2c);
    if (local_2c == this->usage_) {
      glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x92c0,0x88bb,(GLint *)&local_2c);
      if (local_2c == this->access_) {
        glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x92c0,0x911f,(GLint *)&local_2c);
        if (local_2c == this->access_flags_) {
          glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x92c0,0x88bc,(GLint *)&local_2c);
          if (local_2c == this->mapped_) {
            glu::CallLogWrapper::glGetBufferParameteri64v(this_00,0x92c0,0x9121,&local_28);
            if (local_28 == this->map_offset_) {
              glu::CallLogWrapper::glGetBufferParameteri64v(this_00,0x92c0,0x9120,&local_28);
              if (local_28 == this->map_length_) {
                glu::CallLogWrapper::glGetBufferPointerv(this_00,0x92c0,0x88bd,&local_20);
                if (local_20 != this->map_pointer_) {
                  anon_unknown_0::Output("BUFFER_MAP_POINTER is %p should be %p.\n");
                  return -1;
                }
                return 0;
              }
              format = "BUFFER_MAP_LENGTH is %d should be %d.\n";
            }
            else {
              format = "BUFFER_MAP_OFFSET is %d should be %d.\n";
            }
          }
          else {
            format = "BUFFER_MAPPED is %d should be %d.\n";
          }
        }
        else {
          format = "BUFFER_ACCESS_FLAGS is %d should be %d.\n";
        }
      }
      else {
        format = "BUFFER_ACCESS is %d should be %d.\n";
      }
    }
    else {
      format = "BUFFER_USAGE is %d should be %d.\n";
    }
  }
  else {
    format = "BUFFER_SIZE is %d should be %d.\n";
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

long Verify()
	{
		GLint   i;
		GLint64 i64;

		glGetBufferParameteri64v(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_SIZE, &i64);
		if (i64 != size_)
		{
			Output("BUFFER_SIZE is %d should be %d.\n", static_cast<GLint>(i64), static_cast<GLint>(size_));
			return ERROR;
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_USAGE, &i);
		if (i != static_cast<GLint>(usage_))
		{
			Output("BUFFER_USAGE is %d should be %d.\n", i, usage_);
			return ERROR;
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_ACCESS, &i);
		if (i != static_cast<GLint>(access_))
		{
			Output("BUFFER_ACCESS is %d should be %d.\n", i, access_);
			return ERROR;
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_ACCESS_FLAGS, &i);
		if (i != access_flags_)
		{
			Output("BUFFER_ACCESS_FLAGS is %d should be %d.\n", i, access_flags_);
			return ERROR;
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAPPED, &i);
		if (i != mapped_)
		{
			Output("BUFFER_MAPPED is %d should be %d.\n", i, mapped_);
			return ERROR;
		}
		glGetBufferParameteri64v(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAP_OFFSET, &i64);
		if (i64 != map_offset_)
		{
			Output("BUFFER_MAP_OFFSET is %d should be %d.\n", static_cast<GLint>(i64), static_cast<GLint>(map_offset_));
			return ERROR;
		}
		glGetBufferParameteri64v(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAP_LENGTH, &i64);
		if (i64 != map_length_)
		{
			Output("BUFFER_MAP_LENGTH is %d should be %d.\n", static_cast<GLint>(i64), static_cast<GLint>(map_length_));
			return ERROR;
		}

		void* ptr;
		glGetBufferPointerv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);
		if (ptr != map_pointer_)
		{
			Output("BUFFER_MAP_POINTER is %p should be %p.\n", ptr, map_pointer_);
			return ERROR;
		}
		return NO_ERROR;
	}